

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_list.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::peer_list::erase_peers
          (peer_list *this,torrent_state *state,erase_peer_flags_t flags)

{
  iterator *this_00;
  int iVar1;
  torrent_peer *pe;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  ulong uVar5;
  reference pptVar6;
  ulong uVar7;
  _Self *__return_storage_ptr__;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint local_dc;
  _Self local_b8;
  _Self local_90;
  _Self local_70;
  _Self local_50;
  
  iVar1 = state->max_peerlist_size;
  if ((iVar1 != 0) &&
     ((this->m_peers).
      super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
      .
      super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      (this->m_peers).
      super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
      .
      super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur)) {
    if (*(uint *)&this->field_0x60 >> 0x1f != (uint)state->is_finished) {
      recalculate_connect_candidates(this,state);
    }
    this_00 = &(this->m_peers).
               super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               .
               super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               ._M_impl.super__Deque_impl_data._M_start;
    sVar4 = ::std::
            deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
            ::size((deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                    *)this);
    uVar5 = random((aux *)(ulong)((int)sVar4 - 1));
    uVar5 = uVar5 & 0xffffffff;
    iVar3 = (iVar1 * 0x5f) / 100;
    sVar4 = ::std::
            deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
            ::size((deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                    *)this);
    uVar7 = 300;
    if ((int)sVar4 < 300) {
      uVar7 = sVar4 & 0xffffffff;
    }
    local_dc = 0xffffffff;
    uVar9 = 0xffffffff;
    while ((0 < (int)uVar7 &&
           (sVar4 = ::std::
                    deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                    ::size((deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                            *)this), (int)(iVar3 - (uint)(iVar3 == iVar1)) <= (int)sVar4))) {
      sVar4 = ::std::
              deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
              ::size((deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                      *)this);
      if ((int)uVar5 == (int)sVar4) {
        uVar5 = 0;
      }
      uVar8 = (uint)uVar5;
      pptVar6 = ::std::
                _Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
                ::operator[](this_00,(long)(int)uVar8);
      pe = *pptVar6;
      bVar2 = is_erase_candidate(this,pe);
      uVar10 = uVar9;
      if (bVar2) {
        if (uVar9 != 0xffffffff) {
          pptVar6 = ::std::
                    _Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
                    ::operator[](this_00,(long)(int)uVar9);
          bVar2 = anon_unknown.dwarf_8de803::compare_peer_erase(*pptVar6,pe);
          if (bVar2) goto LAB_00258f86;
        }
        uVar10 = uVar8;
        if ((this->m_locked_peer == pe) || ((*(uint *)&pe->field_0x1b & 0x7e0000) != 0x200000))
        goto LAB_00258f86;
        uVar10 = uVar9 - ((int)uVar8 < (int)uVar9);
        local_dc = local_dc - ((int)uVar8 < (int)local_dc);
        local_b8._M_cur =
             (this->m_peers).
             super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
             .
             super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_b8._M_first =
             (this->m_peers).
             super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
             .
             super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
             ._M_impl.super__Deque_impl_data._M_start._M_first;
        local_b8._M_last =
             (this->m_peers).
             super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
             .
             super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last;
        local_b8._M_node =
             (this->m_peers).
             super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
             .
             super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
             ._M_impl.super__Deque_impl_data._M_start._M_node;
        ::std::operator+(&local_50,&local_b8,(long)(int)uVar8);
        erase_peer(this,&local_50,state);
      }
      else {
LAB_00258f86:
        if ((this->m_locked_peer != pe) && (pe->connection == (peer_connection_interface *)0x0)) {
          if (local_dc != 0xffffffff) {
            pptVar6 = ::std::
                      _Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
                      ::operator[](this_00,(long)(int)local_dc);
            bVar2 = anon_unknown.dwarf_8de803::compare_peer_erase(*pptVar6,pe);
            if (bVar2) goto LAB_00258fbd;
          }
          local_dc = uVar8;
        }
LAB_00258fbd:
        uVar5 = (ulong)(uVar8 + 1);
      }
      uVar7 = (ulong)((int)uVar7 - 1);
      uVar9 = uVar10;
    }
    if ((int)uVar9 < 0) {
      if ((flags.m_val & 2) == 0) {
        return;
      }
      if ((int)local_dc < 0) {
        return;
      }
      local_b8._M_cur =
           (this->m_peers).
           super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           .
           super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
      local_b8._M_first =
           (this->m_peers).
           super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           .
           super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           ._M_impl.super__Deque_impl_data._M_start._M_first;
      local_b8._M_last =
           (this->m_peers).
           super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           .
           super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           ._M_impl.super__Deque_impl_data._M_start._M_last;
      local_b8._M_node =
           (this->m_peers).
           super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           .
           super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           ._M_impl.super__Deque_impl_data._M_start._M_node;
      __return_storage_ptr__ = &local_90;
      ::std::operator+(__return_storage_ptr__,&local_b8,(ulong)local_dc);
    }
    else {
      local_b8._M_cur =
           (this->m_peers).
           super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           .
           super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
      local_b8._M_first =
           (this->m_peers).
           super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           .
           super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           ._M_impl.super__Deque_impl_data._M_start._M_first;
      local_b8._M_last =
           (this->m_peers).
           super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           .
           super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           ._M_impl.super__Deque_impl_data._M_start._M_last;
      local_b8._M_node =
           (this->m_peers).
           super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           .
           super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           ._M_impl.super__Deque_impl_data._M_start._M_node;
      __return_storage_ptr__ = &local_70;
      ::std::operator+(__return_storage_ptr__,&local_b8,(ulong)uVar9);
    }
    erase_peer(this,__return_storage_ptr__,state);
  }
  return;
}

Assistant:

void peer_list::erase_peers(torrent_state* state, erase_peer_flags_t const flags)
	{
		TORRENT_ASSERT(is_single_thread());
		INVARIANT_CHECK;

		int max_peerlist_size = state->max_peerlist_size;

		if (max_peerlist_size == 0 || m_peers.empty()) return;

		int erase_candidate = -1;
		int force_erase_candidate = -1;

		if (bool(m_finished) != state->is_finished)
			recalculate_connect_candidates(state);

		int round_robin = aux::numeric_cast<int>(random(std::uint32_t(m_peers.size() - 1)));

		int low_watermark = max_peerlist_size * 95 / 100;
		if (low_watermark == max_peerlist_size) --low_watermark;

		for (int iterations = std::min(int(m_peers.size()), 300);
			iterations > 0; --iterations)
		{
			if (int(m_peers.size()) < low_watermark)
				break;

			if (round_robin == int(m_peers.size())) round_robin = 0;

			torrent_peer& pe = *m_peers[round_robin];
			TORRENT_ASSERT(pe.in_use);
			int const current = round_robin;

			if (is_erase_candidate(pe)
				&& (erase_candidate == -1
					|| !compare_peer_erase(*m_peers[erase_candidate], pe)))
			{
				if (should_erase_immediately(pe))
				{
					if (erase_candidate > current) --erase_candidate;
					if (force_erase_candidate > current) --force_erase_candidate;
					TORRENT_ASSERT(current >= 0 && current < int(m_peers.size()));
					erase_peer(m_peers.begin() + current, state);
					continue;
				}
				else
				{
					erase_candidate = current;
				}
			}
			if (is_force_erase_candidate(pe)
				&& (force_erase_candidate == -1
					|| !compare_peer_erase(*m_peers[force_erase_candidate], pe)))
			{
				force_erase_candidate = current;
			}

			++round_robin;
		}

		if (erase_candidate > -1)
		{
			TORRENT_ASSERT(erase_candidate >= 0 && erase_candidate < int(m_peers.size()));
			erase_peer(m_peers.begin() + erase_candidate, state);
		}
		else if ((flags & force_erase) && force_erase_candidate > -1)
		{
			TORRENT_ASSERT(force_erase_candidate >= 0 && force_erase_candidate < int(m_peers.size()));
			erase_peer(m_peers.begin() + force_erase_candidate, state);
		}
	}